

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O2

void idx2::ExtrapolateCdf53(v3i *Dims3,u64 TransformOrder,volume *Vol)

{
  u64 uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint NLevels;
  long lVar5;
  int iVar6;
  anon_union_12_8_3dedac88_for_v3<int>_1 local_40;
  v3i M3;
  
  uVar1 = Vol->Dims;
  lVar5 = uVar1 << 0x2b;
  iVar3 = (int)(lVar5 >> 0x2b);
  uVar4 = (long)(uVar1 << 0x16) >> 0xb;
  local_40.field_3.XY.field_0 = (v2<int>)(uVar4 & 0xffffffff00000000 | lVar5 >> 0x2b & 0xffffffffU);
  local_40.field_0.Z = (int)((long)(uVar1 * 2) >> 0x2b);
  iVar6 = 1;
  M3.field_0.field_0.X = iVar3 + -1;
  if (lVar5 == 0x80000000000) {
    M3.field_0.field_0.X = iVar6;
  }
  iVar2 = (int)((long)(uVar1 << 0x16) >> 0x2b);
  M3.field_0.field_0.Y = iVar2 + -1;
  if (uVar4 >> 0x20 == 1) {
    M3.field_0.field_0.Y = iVar6;
  }
  M3.field_0.field_0.Z = local_40.field_0.Z + -1;
  if ((long)(uVar1 * 2) >> 0x2b == 1) {
    M3.field_0.field_0.Z = iVar6;
  }
  if (iVar3 <= iVar2) {
    iVar3 = iVar2;
  }
  if (iVar3 <= local_40.field_0.Z) {
    iVar3 = local_40.field_0.Z;
  }
  lVar5 = 0x3f;
  if ((long)iVar3 != 0) {
    for (; (ulong)(long)iVar3 >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  NLevels = -(uint)(iVar3 == 0) | (uint)lVar5;
  ForwardCdf53(Dims3,&M3,0,NLevels,TransformOrder,Vol,false);
  InverseCdf53((v3i *)&local_40.field_0,&M3,0,NLevels,TransformOrder,Vol,false);
  return;
}

Assistant:

void
ExtrapolateCdf53(const v3i& Dims3, u64 TransformOrder, volume* Vol)
{
  v3i N3 = Dims(*Vol);
  v3i M3(N3.X == 1 ? 1 : N3.X - 1, N3.Y == 1 ? 1 : N3.Y - 1, N3.Z == 1 ? 1 : N3.Z - 1);
  // printf("M3 = " idx2_PrStrV3i "\n", idx2_PrV3i(M3));
  idx2_Assert(IsPow2(M3.X) && IsPow2(M3.Y) && IsPow2(M3.Z));
  int NLevels = Log2Floor(Max(Max(N3.X, N3.Y), N3.Z));
  ForwardCdf53(Dims3, M3, 0, NLevels, TransformOrder, Vol);
  InverseCdf53(N3, M3, 0, NLevels, TransformOrder, Vol);
}